

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtilFStream.h
# Opt level: O0

void testutil::OpenStreamWithUTF8Name<std::ofstream>
               (basic_ofstream<char,_std::char_traits<char>_> *is,char *filename,openmode mode)

{
  char *pcVar1;
  _Ios_Openmode in_ESI;
  
  pcVar1 = (char *)std::ofstream::rdbuf();
  std::filebuf::open(pcVar1,in_ESI);
  return;
}

Assistant:

inline void
OpenStreamWithUTF8Name (
    StreamType& is, const char* filename, std::ios_base::openmode mode)
{
#ifdef _WIN32
    std::wstring wfn = WidenFilename (filename);
# ifdef USE_WIDEN_FILEBUF
    using CharT   = typename StreamType::char_type;
    using TraitsT = typename StreamType::traits_type;
    using wbuf    = WidenFilebuf<CharT, TraitsT>;
    if (!static_cast<wbuf*> (is.rdbuf ())->wide_open (wfn, mode))
        is.setstate (std::ios_base::failbit);
    else
        is.clear ();
# else
    is.rdbuf ()->open (wfn.c_str (), mode);
# endif
#else
    is.rdbuf ()->open (filename, mode);
#endif
}